

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,TokenType *token)

{
  char *__s;
  ostream *poVar1;
  allocator<char> local_39;
  string local_38 [8];
  string tokenString;
  TokenType *token_local;
  ostream *stream_local;
  
  __s = TokenNames[*token];
  tokenString.field_2._8_8_ = token;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  poVar1 = std::operator<<(stream,local_38);
  std::__cxx11::string::~string(local_38);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const TokenType &token) {
    string tokenString = TokenNames[token];

    return stream << tokenString;
}